

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O2

unique_ptr<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
__thiscall
spvtools::MakeUnique<spvtools::opt::ValueNumberTable,spvtools::opt::IRContext*>
          (spvtools *this,IRContext **args)

{
  ValueNumberTable *this_00;
  
  this_00 = (ValueNumberTable *)::operator_new(0x80);
  opt::ValueNumberTable::ValueNumberTable(this_00,*args);
  *(ValueNumberTable **)this = this_00;
  return (__uniq_ptr_data<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}